

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

RPCHelpMan * addpeeraddress(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff388;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  UniValue *in_stack_fffffffffffff390;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3c0;
  UniValue *in_stack_fffffffffffff3c8;
  char *in_stack_fffffffffffff3d0;
  undefined7 in_stack_fffffffffffff3d8;
  undefined1 in_stack_fffffffffffff3df;
  string *in_stack_fffffffffffff3e0;
  undefined7 in_stack_fffffffffffff3e8;
  undefined1 in_stack_fffffffffffff3ef;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff3f0;
  string *in_stack_fffffffffffff3f8;
  undefined1 *puVar2;
  RPCArg *in_stack_fffffffffffff400;
  RPCResult *in_stack_fffffffffffff408;
  RPCResult *in_stack_fffffffffffff410;
  undefined1 *local_be8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  RPCHelpMan *name;
  RPCHelpMan *this_01;
  allocator<char> local_a7d;
  allocator<char> local_a7c;
  allocator<char> local_a7b;
  allocator<char> local_a7a [2];
  pointer local_a78;
  pointer pRStack_a70;
  pointer local_a68;
  allocator<char> local_a5a;
  allocator<char> local_a59 [31];
  allocator<char> local_a3a;
  allocator<char> local_a39 [31];
  allocator<char> local_a1a;
  allocator<char> local_a19 [9];
  undefined8 in_stack_fffffffffffff5f0;
  allocator<char> local_9fc;
  undefined1 local_9fb;
  allocator<char> local_9fa;
  allocator<char> local_9f9;
  undefined4 local_9f8;
  allocator<char> local_9f2;
  undefined1 local_9f1 [8];
  RPCResults local_9e9;
  vector<RPCArg,_std::allocator<RPCArg>_> local_9ca [16];
  undefined1 local_848 [272];
  undefined1 local_738 [200];
  undefined1 local_670;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined1 local_630;
  undefined1 local_62f;
  undefined1 local_530;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined1 local_4f0;
  undefined1 local_4ef;
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (RPCHelpMan *)
            ((long)&local_9ca[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start + 1);
  name = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  args = local_9ca;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  results = &local_9e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  local_9f1._1_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff398,&in_stack_fffffffffffff390->typ);
  examples = (RPCExamples *)local_9f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff3a0);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff388);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
                 (Type)((ulong)in_stack_fffffffffffff3f0 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff3ef,in_stack_fffffffffffff3e8),
                 in_stack_fffffffffffff3e0,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  local_9f8 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff398,&in_stack_fffffffffffff390->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  local_530 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff3a0);
  local_508 = 0;
  uStack_500 = 0;
  local_4f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff388);
  local_4f0 = 0;
  local_4ef = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
                 (Type)((ulong)in_stack_fffffffffffff3f0 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff3ef,in_stack_fffffffffffff3e8),
                 in_stack_fffffffffffff3e0,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  local_9fb = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff3c8,(bool *)in_stack_fffffffffffff3c0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff398,in_stack_fffffffffffff390);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  local_670 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff3a0);
  local_648 = 0;
  uStack_640 = 0;
  local_638 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff388);
  local_630 = 0;
  local_62f = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff400,in_stack_fffffffffffff3f8,
                 (Type)((ulong)in_stack_fffffffffffff3f0 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff3ef,in_stack_fffffffffffff3e8),
                 in_stack_fffffffffffff3e0,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8));
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff388);
  __l._M_len._0_7_ = in_stack_fffffffffffff3d8;
  __l._M_array = (iterator)in_stack_fffffffffffff3d0;
  __l._M_len._7_1_ = in_stack_fffffffffffff3df;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff3c8,__l,
             (allocator_type *)in_stack_fffffffffffff3c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  local_a59[1] = (allocator<char>)0x0;
  local_a59[2] = (allocator<char>)0x0;
  local_a59[3] = (allocator<char>)0x0;
  local_a59[4] = (allocator<char>)0x0;
  local_a59[5] = (allocator<char>)0x0;
  local_a59[6] = (allocator<char>)0x0;
  local_a59[7] = (allocator<char>)0x0;
  local_a59[8] = (allocator<char>)0x0;
  local_a59[9] = (allocator<char>)0x0;
  local_a59[10] = (allocator<char>)0x0;
  local_a59[0xb] = (allocator<char>)0x0;
  local_a59[0xc] = (allocator<char>)0x0;
  local_a59[0xd] = (allocator<char>)0x0;
  local_a59[0xe] = (allocator<char>)0x0;
  local_a59[0xf] = (allocator<char>)0x0;
  local_a59[0x10] = (allocator<char>)0x0;
  local_a59[0x11] = (allocator<char>)0x0;
  local_a59[0x12] = (allocator<char>)0x0;
  local_a59[0x13] = (allocator<char>)0x0;
  local_a59[0x14] = (allocator<char>)0x0;
  local_a59[0x15] = (allocator<char>)0x0;
  local_a59[0x16] = (allocator<char>)0x0;
  local_a59[0x17] = (allocator<char>)0x0;
  local_a59[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff388);
  RPCResult::RPCResult
            (in_stack_fffffffffffff410,(Type)((ulong)in_stack_fffffffffffff408 >> 0x20),
             &in_stack_fffffffffffff400->m_names,in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0
             ,(bool)in_stack_fffffffffffff3ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  local_a78 = (pointer)0x0;
  pRStack_a70 = (pointer)0x0;
  local_a68 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff388);
  this = (allocator<RPCResult> *)((ulong)in_stack_fffffffffffff388 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_fffffffffffff408,(Type)((ulong)in_stack_fffffffffffff400 >> 0x20),
             in_stack_fffffffffffff3f8,SUB81((ulong)in_stack_fffffffffffff3f0 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffff3ef,in_stack_fffffffffffff3e8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3e0,
             (bool)in_stack_fffffffffffff3df);
  std::allocator<RPCResult>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff3d8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff3d0;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff3df;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3c8,__l_00,
             (allocator_type *)in_stack_fffffffffffff3c0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff410,(Type)((ulong)in_stack_fffffffffffff408 >> 0x20),
             &in_stack_fffffffffffff400->m_names,in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0
             ,(bool)in_stack_fffffffffffff3ef);
  RPCResults::RPCResults
            ((RPCResults *)in_stack_fffffffffffff408,(RPCResult *)in_stack_fffffffffffff400);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  HelpExampleCli(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff3df,in_stack_fffffffffffff3d8),in_stack_fffffffffffff3d0
             ,(allocator<char> *)in_stack_fffffffffffff3c8);
  HelpExampleRpc(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
  std::operator+(in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x654547);
  this_00 = (RPCArg *)&stack0xfffffffffffff560;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<addpeeraddress()::__0,void>
            (in_stack_fffffffffffff398,(anon_class_1_0_00000001 *)in_stack_fffffffffffff390);
  RPCHelpMan::RPCHelpMan
            (this_01,&name->m_name,&in_RDI->m_name,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff5f0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_a7d);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_a7c);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_a7b);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_a7a);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff398);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar2 = local_848;
  local_be8 = local_738;
  do {
    local_be8 = local_be8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (local_be8 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff398);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_a5a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_a59);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff398);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_a3a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_a39);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_a1a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_a19);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff398);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar2 = local_360;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_9fc);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_9fa);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_9f9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_9f2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_9f1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_9ca);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&local_9ca[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                     super__Vector_impl_data._M_start + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return name;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan addpeeraddress()
{
    return RPCHelpMan{"addpeeraddress",
        "Add the address of a potential peer to an address manager table. This RPC is for testing only.",
        {
            {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The IP address of the peer"},
            {"port", RPCArg::Type::NUM, RPCArg::Optional::NO, "The port of the peer"},
            {"tried", RPCArg::Type::BOOL, RPCArg::Default{false}, "If true, attempt to add the peer to the tried addresses table"},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::BOOL, "success", "whether the peer address was successfully added to the address manager table"},
                {RPCResult::Type::STR, "error", /*optional=*/true, "error description, if the address could not be added"},
            },
        },
        RPCExamples{
            HelpExampleCli("addpeeraddress", "\"1.2.3.4\" 8333 true")
    + HelpExampleRpc("addpeeraddress", "\"1.2.3.4\", 8333, true")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    AddrMan& addrman = EnsureAnyAddrman(request.context);

    const std::string& addr_string{request.params[0].get_str()};
    const auto port{request.params[1].getInt<uint16_t>()};
    const bool tried{request.params[2].isNull() ? false : request.params[2].get_bool()};

    UniValue obj(UniValue::VOBJ);
    std::optional<CNetAddr> net_addr{LookupHost(addr_string, false)};
    bool success{false};

    if (net_addr.has_value()) {
        CService service{net_addr.value(), port};
        CAddress address{MaybeFlipIPv6toCJDNS(service), ServiceFlags{NODE_NETWORK | NODE_WITNESS}};
        address.nTime = Now<NodeSeconds>();
        // The source address is set equal to the address. This is equivalent to the peer
        // announcing itself.
        if (addrman.Add({address}, address)) {
            success = true;
            if (tried) {
                // Attempt to move the address to the tried addresses table.
                if (!addrman.Good(address)) {
                    success = false;
                    obj.pushKV("error", "failed-adding-to-tried");
                }
            }
        } else {
            obj.pushKV("error", "failed-adding-to-new");
        }
    }

    obj.pushKV("success", success);
    return obj;
},
    };
}